

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

string * __thiscall
Tokenizer::makeErrorMessage(string *__return_storage_ptr__,Tokenizer *this,string *err)

{
  ostream *poVar1;
  Mark *this_00;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"ERROR: (");
  this_00 = Stream::getMark(&this->stream_);
  Mark::to_string_abi_cxx11_(&sStack_1c8,this_00);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_1c8);
  poVar1 = std::operator<<(poVar1,") ");
  std::operator<<(poVar1,(string *)err);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string Tokenizer::makeErrorMessage(std::string err) const
{
  std::stringstream ss;
  ss << "ERROR: (" << stream_.getMark().to_string() << ") " << err;
  return ss.str();
}